

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

void __thiscall ThreadData::runInThread(ThreadData *this)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  iVar1 = *(int *)(in_FS_OFFSET + -0x30);
  if (iVar1 == 0) {
    CurrentThread::cacheTid();
    iVar1 = *(int *)(in_FS_OFFSET + -0x30);
  }
  *this->tid_ = iVar1;
  this->tid_ = (pid_t *)0x0;
  CountDownLatch::countDown(this->latch_);
  this->latch_ = (CountDownLatch *)0x0;
  if ((this->name_)._M_string_length == 0) {
    pcVar2 = "Thread";
  }
  else {
    pcVar2 = (this->name_)._M_dataplus._M_p;
  }
  *(char **)(in_FS_OFFSET + -0x48) = pcVar2;
  lVar3 = 0xf;
  prctl(0xf);
  if ((this->func_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->func_)._M_invoker)((_Any_data *)this);
    *(char **)(in_FS_OFFSET + -0x48) = "finished";
    return;
  }
  std::__throw_bad_function_call();
  pthread_cond_destroy((pthread_cond_t *)(lVar3 + 0x38));
  pthread_mutex_lock((pthread_mutex_t *)(lVar3 + 8));
  pthread_mutex_destroy((pthread_mutex_t *)(lVar3 + 8));
  return;
}

Assistant:

void runInThread(){
        *tid_=CurrentThread::tid();
        tid_=nullptr;
        latch_->countDown();
        latch_=nullptr;

        CurrentThread::t_threadName = name_.empty()?"Thread":name_.c_str();
        prctl(PR_SET_NAME, CurrentThread::t_threadName);

        func_();
        CurrentThread::t_threadName = "finished";
    }